

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs)

{
  uint *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pnVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  type t;
  cpp_dec_float<100U,_int,_void> local_118;
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  uint auStack_a0 [2];
  uint local_98 [2];
  uint auStack_90 [4];
  cpp_dec_float<100U,_int,_void> local_80;
  
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  iVar14 = (rhs->super_IdxSet).len;
  *(int *)(this + 0xc) = iVar14;
  spx_realloc<int*>((int **)(this + 0x10),iVar14);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(this + 0x20),
          (int)((ulong)((long)(rhs->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(rhs->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333,true);
  *(element_type **)(this + 0x40) =
       (rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x48),
             &(rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (rhs->setupStatus == true) {
    IdxSet::operator=((IdxSet *)this,&rhs->super_IdxSet);
    if (0 < (long)*(int *)(this + 8)) {
      lVar15 = (long)*(int *)(this + 8) + 1;
      do {
        lVar16 = (long)(*(int **)(this + 0x10))[lVar15 + -2];
        pnVar4 = (rhs->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar16 * 0x50;
        lVar5 = *(long *)(this + 0x20);
        uVar7 = *(undefined8 *)&pnVar4[lVar16].m_backend.data;
        uVar8 = *(undefined8 *)((long)&pnVar4[lVar16].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar4[lVar16].m_backend.data + 0x10);
        uVar9 = *(undefined8 *)puVar1;
        uVar10 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar4[lVar16].m_backend.data + 0x20);
        uVar11 = *(undefined8 *)puVar1;
        uVar12 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar4[lVar16].m_backend.data + 0x30);
        uVar13 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (undefined8 *)(lVar5 + 0x30 + lVar6);
        *puVar2 = *(undefined8 *)puVar1;
        puVar2[1] = uVar13;
        puVar2 = (undefined8 *)(lVar5 + 0x20 + lVar6);
        *puVar2 = uVar11;
        puVar2[1] = uVar12;
        puVar2 = (undefined8 *)(lVar5 + 0x10 + lVar6);
        *puVar2 = uVar9;
        puVar2[1] = uVar10;
        *(undefined8 *)(lVar5 + lVar6) = uVar7;
        ((undefined8 *)(lVar5 + lVar6))[1] = uVar8;
        *(int *)(lVar5 + 0x40 + lVar6) = pnVar4[lVar16].m_backend.exp;
        *(bool *)(lVar5 + 0x44 + lVar6) = pnVar4[lVar16].m_backend.neg;
        *(undefined8 *)(lVar5 + 0x48 + lVar6) = *(undefined8 *)&pnVar4[lVar16].m_backend.fpclass;
        lVar15 = lVar15 + -1;
      } while (1 < lVar15);
    }
  }
  else {
    uVar17 = (int)((long)(rhs->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(rhs->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
    *(undefined4 *)(this + 8) = 0;
    if (0 < (int)uVar17) {
      lVar15 = 0;
      uVar18 = 0;
      do {
        pnVar4 = (rhs->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(int *)((long)&(pnVar4->m_backend).data + lVar15 + 0x48) == 2) {
LAB_003f06df:
          pnVar4 = (rhs->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar15);
          local_118.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_118.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar15 + 0x10);
          local_118.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_118.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar15 + 0x20);
          local_118.data._M_elems._32_8_ = *(undefined8 *)puVar1;
          local_118.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar15 + 0x30);
          local_118.data._M_elems._48_8_ = *(undefined8 *)puVar1;
          local_118.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
          local_118.exp = *(int *)((long)&(pnVar4->m_backend).data + lVar15 + 0x40);
          local_118.neg = *(bool *)((long)&(pnVar4->m_backend).data + lVar15 + 0x44);
          local_118._72_8_ = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar15 + 0x48);
          if ((local_118.neg == true) &&
             (local_118.fpclass != cpp_dec_float_finite || local_118.data._M_elems[0] != 0)) {
            local_118.neg = false;
          }
          local_c8 = (uint  [2])local_118.data._M_elems._0_8_;
          auStack_c0 = (uint  [2])local_118.data._M_elems._8_8_;
          local_b8 = (uint  [2])local_118.data._M_elems._16_8_;
          auStack_b0 = (uint  [2])local_118.data._M_elems._24_8_;
          local_a8 = (uint  [2])local_118.data._M_elems._32_8_;
          auStack_a0 = (uint  [2])local_118.data._M_elems._40_8_;
          local_98 = (uint  [2])local_118.data._M_elems._48_8_;
          auStack_90._0_8_ = local_118.data._M_elems._56_8_;
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_80,
                       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)this);
          if (((local_118.fpclass == cpp_dec_float_NaN) || (local_80.fpclass == cpp_dec_float_NaN))
             || (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (&local_118,&local_80), iVar14 < 1)) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      ((cpp_dec_float<100U,_int,_void> *)
                       ((long)&(((rhs->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                       lVar15),0);
          }
          else {
            (rhs->super_IdxSet).idx[*(int *)(this + 8)] = (int)uVar18;
            *(int *)(*(long *)(this + 0x10) + (long)*(int *)(this + 8) * 4) = (int)uVar18;
            pnVar4 = (rhs->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar5 = *(long *)(this + 0x20);
            puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar15);
            uVar7 = *puVar2;
            uVar8 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar15 + 0x10);
            uVar9 = *puVar2;
            uVar10 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar15 + 0x20);
            uVar11 = *puVar2;
            uVar12 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar15 + 0x30);
            uVar13 = puVar2[1];
            puVar3 = (undefined8 *)(lVar5 + 0x30 + lVar15);
            *puVar3 = *puVar2;
            puVar3[1] = uVar13;
            puVar2 = (undefined8 *)(lVar5 + 0x20 + lVar15);
            *puVar2 = uVar11;
            puVar2[1] = uVar12;
            puVar2 = (undefined8 *)(lVar5 + 0x10 + lVar15);
            *puVar2 = uVar9;
            puVar2[1] = uVar10;
            *(undefined8 *)(lVar5 + lVar15) = uVar7;
            ((undefined8 *)(lVar5 + lVar15))[1] = uVar8;
            *(undefined4 *)(lVar5 + 0x40 + lVar15) =
                 *(undefined4 *)((long)&(pnVar4->m_backend).data + lVar15 + 0x40);
            *(undefined1 *)(lVar5 + 0x44 + lVar15) =
                 *(undefined1 *)((long)&(pnVar4->m_backend).data + lVar15 + 0x44);
            *(undefined8 *)(lVar5 + 0x48 + lVar15) =
                 *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar15 + 0x48);
            *(int *)(this + 8) = *(int *)(this + 8) + 1;
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                    (&local_118,0,(type *)0x0);
          iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             ((cpp_dec_float<100U,_int,_void> *)
                              ((long)&(pnVar4->m_backend).data + lVar15),&local_118);
          if (iVar14 != 0) goto LAB_003f06df;
        }
        uVar18 = uVar18 + 1;
        lVar15 = lVar15 + 0x50;
      } while ((uVar17 & 0x7fffffff) != uVar18);
    }
    (rhs->super_IdxSet).num = *(int *)(this + 8);
    rhs->setupStatus = true;
  }
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x1;
  return;
}

Assistant:

void setup_and_assign(SSVectorBase<S>& rhs)
   {
      clear();
      setMax(rhs.max());
      VectorBase<R>::reDim(rhs.dim());
      _tolerances = rhs.tolerances();

      if(rhs.isSetup())
      {
         IdxSet::operator=(rhs);

         for(int i = size() - 1; i >= 0; --i)
         {
            int j  = index(i);
            VectorBase<R>::val[j] = rhs.val[j];
         }
      }
      else
      {
         int d = rhs.dim();
         num = 0;

         for(int i = 0; i < d; ++i)
         {
            if(rhs.val[i] != 0)
            {
               if(spxAbs(rhs.val[i]) > this->getEpsilon())
               {
                  rhs.idx[num] = i;
                  idx[num] = i;
                  VectorBase<R>::val[i] = rhs.val[i];
                  num++;
               }
               else
                  rhs.val[i] = 0;
            }
         }

         rhs.num = num;
         rhs.setupStatus = true;
      }

      setupStatus = true;

      assert(rhs.isConsistent());
      assert(isConsistent());
   }